

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

word If_ManSat6Truth(word uBound,word uFree,int *pBSet,int nBSet,int *pSSet,int nSSet,int *pFSet,
                    int nFSet)

{
  word wVar1;
  int local_70;
  int local_6c;
  int k;
  int i;
  word f [4];
  word q;
  word r;
  int nSSet_local;
  int *pSSet_local;
  int nBSet_local;
  int *pBSet_local;
  word uFree_local;
  word uBound_local;
  
  local_70 = 0;
  for (local_6c = 0; local_6c < nSSet; local_6c = local_6c + 1) {
    *(word *)(&k + (long)local_70 * 2) = s_Truths6[pSSet[local_6c]];
    local_70 = local_70 + 1;
  }
  for (local_6c = 0; local_6c < nBSet; local_6c = local_6c + 1) {
    *(word *)(&k + (long)local_70 * 2) = s_Truths6[pBSet[local_6c]];
    local_70 = local_70 + 1;
  }
  _k = If_ManSat6ComposeLut4((uint)uBound & 0xffff,(word *)&k,local_70);
  local_70 = 1;
  f[3] = _k;
  for (local_6c = 0; local_6c < nSSet; local_6c = local_6c + 1) {
    *(word *)(&k + (long)local_70 * 2) = s_Truths6[pSSet[local_6c]];
    local_70 = local_70 + 1;
  }
  for (local_6c = 0; local_6c < nFSet; local_6c = local_6c + 1) {
    *(word *)(&k + (long)local_70 * 2) = s_Truths6[pFSet[local_6c]];
    local_70 = local_70 + 1;
  }
  wVar1 = If_ManSat6ComposeLut4((uint)uFree & 0xffff,(word *)&k,local_70);
  return wVar1;
}

Assistant:

word If_ManSat6Truth( word uBound, word uFree, int * pBSet, int nBSet, int * pSSet, int nSSet, int * pFSet, int nFSet )
{
    word r, q, f[4];
    int i, k = 0;
    // bound set vars
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nBSet; i++ )
        f[k++] = s_Truths6[pBSet[i]];
    q = If_ManSat6ComposeLut4( (int)(uBound & 0xffff), f, k );
    // free set vars
    k = 0;
    f[k++] = q;
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nFSet; i++ )
        f[k++] = s_Truths6[pFSet[i]];
    r = If_ManSat6ComposeLut4( (int)(uFree & 0xffff), f, k );
    return r;
}